

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

void __thiscall
CoreML::TreeEnsembleBase::setupBranchNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,size_t feature_index,
          BranchMode branchMode,double feature_value,size_t trueChildNodeId,size_t falseChildNodeId)

{
  TreeEnsembleParameters_TreeNode *pTVar1;
  
  pTVar1 = _getNode(this,treeId,nodeId,true);
  pTVar1->branchfeatureindex_ = feature_index;
  pTVar1->nodebehavior_ = branchMode;
  pTVar1->branchfeaturevalue_ = feature_value;
  pTVar1->truechildnodeid_ = trueChildNodeId;
  pTVar1->falsechildnodeid_ = falseChildNodeId;
  return;
}

Assistant:

void TreeEnsembleBase::setupBranchNode
    (size_t treeId, size_t nodeId, size_t feature_index,
     BranchMode branchMode,
     double feature_value,
     size_t trueChildNodeId, size_t falseChildNodeId) {

        auto& node = _getNode(treeId, nodeId, true);

        // TODO: Error checking routines -- make sure this node hasn't been requested before.
        node.set_branchfeatureindex(feature_index);
        node.set_nodebehavior(static_cast<Specification::TreeEnsembleParameters::TreeNode::TreeNodeBehavior>(branchMode));
        node.set_branchfeaturevalue(feature_value);
        node.set_truechildnodeid(trueChildNodeId);
        node.set_falsechildnodeid(falseChildNodeId);
    }